

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::TiledOutputFile::setFrameBuffer(TiledOutputFile *this,FrameBuffer *frameBuffer)

{
  PixelType PVar1;
  size_t xs;
  size_t ys;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  ArgExc *pAVar5;
  const_iterator this_00;
  const_iterator __x;
  Channel *pCVar6;
  Slice *pSVar7;
  ConstIterator j_1;
  ConstIterator i_1;
  vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
  slices;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  ConstIterator j;
  ConstIterator i;
  ChannelList *channels;
  Lock lock;
  uint in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffa9c;
  uint in_stack_fffffffffffffaa0;
  undefined4 in_stack_fffffffffffffaa4;
  undefined4 in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffaac;
  Slice *in_stack_fffffffffffffab0;
  Slice *in_stack_fffffffffffffba0;
  Channel *in_stack_fffffffffffffba8;
  TOutSliceInfo local_400;
  TOutSliceInfo local_3d0;
  const_iterator local_3a0;
  const_iterator local_398;
  const_iterator local_390;
  const_iterator local_388;
  stringstream local_368 [16];
  ostream local_358 [376];
  stringstream local_1e0 [16];
  ostream local_1d0 [376];
  const_iterator local_58;
  const_iterator local_50;
  const_iterator local_48;
  const_iterator local_40;
  ChannelList *local_28;
  
  IlmThread_2_5::Lock::Lock
            ((Lock *)in_stack_fffffffffffffab0,
             (Mutex *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
             SUB41((uint)in_stack_fffffffffffffaa4 >> 0x18,0));
  local_28 = Header::channels((Header *)0x1a380e);
  local_40._M_node =
       (_Base_ptr)
       ChannelList::begin((ChannelList *)
                          CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
  do {
    local_48._M_node =
         (_Base_ptr)
         ChannelList::end((ChannelList *)
                          CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
    bVar2 = Imf_2_5::operator!=((ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                                (ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
    if (!bVar2) {
      std::
      vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
      ::vector((vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                *)0x1a3c05);
      this_00._M_node =
           (_Base_ptr)
           ChannelList::begin((ChannelList *)
                              CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
      local_388._M_node = this_00._M_node;
      while( true ) {
        __x._M_node = (_Base_ptr)
                      ChannelList::end((ChannelList *)
                                       CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98)
                                      );
        local_390._M_node = __x._M_node;
        bVar2 = Imf_2_5::operator!=((ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                                    (ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
        if (!bVar2) break;
        ChannelList::ConstIterator::name((ConstIterator *)0x1a3c9e);
        local_398._M_node =
             (_Base_ptr)
             FrameBuffer::find((FrameBuffer *)in_stack_fffffffffffffba8,
                               (char *)in_stack_fffffffffffffba0);
        local_3a0._M_node =
             (_Base_ptr)
             FrameBuffer::end((FrameBuffer *)
                              CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
        bVar2 = Imf_2_5::operator==((ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                                    (ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
        if (bVar2) {
          pCVar6 = ChannelList::ConstIterator::channel((ConstIterator *)0x1a3d2d);
          in_stack_fffffffffffffaa0 = 0;
          in_stack_fffffffffffffa98 = 0;
          anon_unknown_5::TOutSliceInfo::TOutSliceInfo
                    (&local_3d0,pCVar6->type,(char *)0x0,0,0,true,0,0);
          std::
          vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
          ::push_back((vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                       *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                      (value_type *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
        }
        else {
          pSVar7 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x1a3dba);
          PVar1 = pSVar7->type;
          pSVar7 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x1a3dd9);
          pcVar4 = pSVar7->base;
          pSVar7 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x1a3dfb);
          xs = pSVar7->xStride;
          pSVar7 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x1a3e1d);
          ys = pSVar7->yStride;
          pSVar7 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x1a3e3f);
          in_stack_fffffffffffffa98 = pSVar7->xTileCoords & 1;
          in_stack_fffffffffffffab0 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x1a3e63);
          in_stack_fffffffffffffaa0 = in_stack_fffffffffffffab0->yTileCoords & 1;
          anon_unknown_5::TOutSliceInfo::TOutSliceInfo
                    (&local_400,PVar1,pcVar4,xs,ys,false,in_stack_fffffffffffffa98,
                     in_stack_fffffffffffffaa0);
          std::
          vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
          ::push_back((vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                       *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                      (value_type *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
        }
        ChannelList::ConstIterator::operator++
                  ((ConstIterator *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0));
      }
      FrameBuffer::operator=
                ((FrameBuffer *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                 (FrameBuffer *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
      std::
      vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
      ::operator=((vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                   *)this_00._M_node,
                  (vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                   *)__x._M_node);
      std::
      vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
      ::~vector((vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
                 *)in_stack_fffffffffffffab0);
      IlmThread_2_5::Lock::~Lock
                ((Lock *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0));
      return;
    }
    ChannelList::ConstIterator::name((ConstIterator *)0x1a38c1);
    local_50._M_node =
         (_Base_ptr)
         FrameBuffer::find((FrameBuffer *)in_stack_fffffffffffffba8,
                           (char *)in_stack_fffffffffffffba0);
    local_58._M_node =
         (_Base_ptr)
         FrameBuffer::end((FrameBuffer *)
                          CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
    bVar2 = Imf_2_5::operator==((ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                                (ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
    if (!bVar2) {
      in_stack_fffffffffffffba8 = ChannelList::ConstIterator::channel((ConstIterator *)0x1a3977);
      PVar1 = in_stack_fffffffffffffba8->type;
      in_stack_fffffffffffffba0 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x1a399f);
      if (PVar1 != in_stack_fffffffffffffba0->type) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_1e0);
        poVar3 = std::operator<<(local_1d0,"Pixel type of \"");
        pcVar4 = ChannelList::ConstIterator::name((ConstIterator *)0x1a3a03);
        poVar3 = std::operator<<(poVar3,pcVar4);
        poVar3 = std::operator<<(poVar3,"\" channel of output file \"");
        pcVar4 = fileName((TiledOutputFile *)0x1a3a57);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::operator<<(poVar3,"\" is not compatible with the frame buffer\'s pixel type.");
        pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar5,local_1e0);
        __cxa_throw(pAVar5,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      pSVar7 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x1a3b0b);
      if ((pSVar7->xSampling != 1) ||
         (pSVar7 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x1a3b30),
         pSVar7->ySampling != 1)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_368);
        std::operator<<(local_358,"All channels in a tiled file must havesampling (1,1).");
        pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar5,local_368);
        __cxa_throw(pAVar5,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
    }
    ChannelList::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0));
  } while( true );
}

Assistant:

void	
TiledOutputFile::setFrameBuffer (const FrameBuffer &frameBuffer)
{
    Lock lock (*_streamData);

    //
    // Check if the new frame buffer descriptor
    // is compatible with the image file header.
    //

    const ChannelList &channels = _data->header.channels();

    for (ChannelList::ConstIterator i = channels.begin();
	 i != channels.end();
	 ++i)
    {
	FrameBuffer::ConstIterator j = frameBuffer.find (i.name());

	if (j == frameBuffer.end())
	    continue;

	if (i.channel().type != j.slice().type)
	    THROW (IEX_NAMESPACE::ArgExc, "Pixel type of \"" << i.name() << "\" channel "
				"of output file \"" << fileName() << "\" is "
				"not compatible with the frame buffer's "
				"pixel type.");

	if (j.slice().xSampling != 1 || j.slice().ySampling != 1)
	    THROW (IEX_NAMESPACE::ArgExc, "All channels in a tiled file must have"
				"sampling (1,1).");
    }
    
    //
    // Initialize slice table for writePixels().
    //

    vector<TOutSliceInfo> slices;

    for (ChannelList::ConstIterator i = channels.begin();
	 i != channels.end();
	 ++i)
    {
	FrameBuffer::ConstIterator j = frameBuffer.find (i.name());

	if (j == frameBuffer.end())
	{
	    //
	    // Channel i is not present in the frame buffer.
	    // In the file, channel i will contain only zeroes.
	    //

	    slices.push_back (TOutSliceInfo (i.channel().type,
					     0, // base
					     0, // xStride,
					     0, // yStride,
					     true)); // zero
	}
	else
	{
	    //
	    // Channel i is present in the frame buffer.
	    //

	    slices.push_back (TOutSliceInfo (j.slice().type,
					     j.slice().base,
					     j.slice().xStride,
					     j.slice().yStride,
					     false, // zero
                                             (j.slice().xTileCoords)? 1: 0,
                                             (j.slice().yTileCoords)? 1: 0));
	}
    }

    //
    // Store the new frame buffer.
    //

    _data->frameBuffer = frameBuffer;
    _data->slices = slices;
}